

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGeneratorTarget.cxx
# Opt level: O1

void __thiscall
cmGeneratorTarget::GetObjectLibrariesCMP0026
          (cmGeneratorTarget *this,
          vector<cmGeneratorTarget_*,_std::allocator<cmGeneratorTarget_*>_> *objlibs)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  pointer pcVar2;
  iterator __position;
  pointer pbVar3;
  int iVar4;
  size_type sVar5;
  pointer pbVar6;
  __normal_iterator<const_BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_*,_std::vector<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
  _Var7;
  cmBTStringRange cVar8;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  init;
  basic_string_view<char,_std::char_traits<char>_> __str;
  string objLibName;
  cmGeneratorTarget *objLib;
  cmList files;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_88;
  vector<cmGeneratorTarget*,std::allocator<cmGeneratorTarget*>> *local_68;
  __normal_iterator<const_BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_*,_std::vector<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
  local_60;
  cmGeneratorTarget *local_58;
  cmGeneratorTarget *local_50;
  cmList local_48;
  
  local_68 = (vector<cmGeneratorTarget*,std::allocator<cmGeneratorTarget*>> *)objlibs;
  local_58 = this;
  cVar8 = cmTarget::GetSourceEntries_abi_cxx11_(this->Target);
  if (cVar8.Begin._M_current._M_current != cVar8.End._M_current._M_current) {
    paVar1 = &local_88.field_2;
    do {
      local_60 = cVar8.End._M_current;
      _Var7 = cVar8.Begin._M_current;
      pcVar2 = ((_Var7._M_current)->Value)._M_dataplus._M_p;
      local_88._M_dataplus._M_p = (pointer)paVar1;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_88,pcVar2,pcVar2 + ((_Var7._M_current)->Value)._M_string_length);
      init._M_len = 1;
      init._M_array = &local_88;
      cmList::cmList(&local_48,init);
      pbVar6 = local_48.Values.
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      pbVar3 = local_48.Values.
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_finish;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_88._M_dataplus._M_p != paVar1) {
        operator_delete(local_88._M_dataplus._M_p,local_88.field_2._M_allocated_capacity + 1);
        pbVar6 = local_48.Values.
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        pbVar3 = local_48.Values.
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish;
      }
      for (; pbVar6 != pbVar3; pbVar6 = pbVar6 + 1) {
        local_88._M_string_length = (size_type)(pbVar6->_M_dataplus)._M_p;
        local_88._M_dataplus._M_p = (pointer)pbVar6->_M_string_length;
        __str._M_str = "$<TARGET_OBJECTS:";
        __str._M_len = 0x11;
        iVar4 = std::basic_string_view<char,_std::char_traits<char>_>::compare
                          ((basic_string_view<char,_std::char_traits<char>_> *)&local_88,0,0x11,
                           __str);
        if ((iVar4 == 0) && ((pbVar6->_M_dataplus)._M_p[pbVar6->_M_string_length - 1] == '>')) {
          std::__cxx11::string::substr((ulong)&local_88,(ulong)pbVar6);
          sVar5 = cmGeneratorExpression::Find(&local_88);
          if ((sVar5 == 0xffffffffffffffff) &&
             (local_50 = cmLocalGenerator::FindGeneratorTargetToUse
                                   (local_58->LocalGenerator,&local_88),
             local_50 != (cmGeneratorTarget *)0x0)) {
            __position._M_current = *(cmGeneratorTarget ***)(local_68 + 8);
            if (__position._M_current == *(cmGeneratorTarget ***)(local_68 + 0x10)) {
              std::vector<cmGeneratorTarget*,std::allocator<cmGeneratorTarget*>>::
              _M_realloc_insert<cmGeneratorTarget*const&>(local_68,__position,&local_50);
            }
            else {
              *__position._M_current = local_50;
              *(long *)(local_68 + 8) = *(long *)(local_68 + 8) + 8;
            }
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_88._M_dataplus._M_p != paVar1) {
            operator_delete(local_88._M_dataplus._M_p,local_88.field_2._M_allocated_capacity + 1);
          }
        }
      }
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector(&local_48.Values);
      cVar8.End._M_current = local_60._M_current;
      cVar8.Begin._M_current = _Var7._M_current + 1;
    } while (_Var7._M_current + 1 != local_60._M_current);
  }
  return;
}

Assistant:

void cmGeneratorTarget::GetObjectLibrariesCMP0026(
  std::vector<cmGeneratorTarget*>& objlibs) const
{
  // At configure-time, this method can be called as part of getting the
  // LOCATION property or to export() a file to be include()d.  However
  // there is no cmGeneratorTarget at configure-time, so search the SOURCES
  // for TARGET_OBJECTS instead for backwards compatibility with OLD
  // behavior of CMP0024 and CMP0026 only.
  cmBTStringRange rng = this->Target->GetSourceEntries();
  for (auto const& entry : rng) {
    cmList files{ entry.Value };
    for (auto const& li : files) {
      if (cmHasLiteralPrefix(li, "$<TARGET_OBJECTS:") && li.back() == '>') {
        std::string objLibName = li.substr(17, li.size() - 18);

        if (cmGeneratorExpression::Find(objLibName) != std::string::npos) {
          continue;
        }
        cmGeneratorTarget* objLib =
          this->LocalGenerator->FindGeneratorTargetToUse(objLibName);
        if (objLib) {
          objlibs.push_back(objLib);
        }
      }
    }
  }
}